

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::InternalSwap
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *other)

{
  TreeEnsembleParameters_TreeNode *other_local;
  TreeEnsembleParameters_TreeNode *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::
  InternalSwap(&this->evaluationinfo_,&other->evaluationinfo_);
  google::protobuf::internal::memswap<64>((char *)&this->treeid_,(char *)&other->treeid_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::InternalSwap(TreeEnsembleParameters_TreeNode* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  evaluationinfo_.InternalSwap(&other->evaluationinfo_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(TreeEnsembleParameters_TreeNode, relativehitrate_)
      + sizeof(TreeEnsembleParameters_TreeNode::relativehitrate_)
      - PROTOBUF_FIELD_OFFSET(TreeEnsembleParameters_TreeNode, treeid_)>(
          reinterpret_cast<char*>(&treeid_),
          reinterpret_cast<char*>(&other->treeid_));
}